

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_time.c
# Opt level: O1

void zt_time_print_result(time_result *tr,char *name,int n)

{
  double dVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  float fVar5;
  
  fVar5 = (float)((double)(tr->usr_time).tv_usec / 1000000.0 + (double)(tr->usr_time).tv_sec);
  fVar2 = (float)((double)(tr->sys_time).tv_usec / 1000000.0 + (double)(tr->sys_time).tv_sec);
  dVar1 = (double)fVar5;
  dVar3 = (double)fVar2;
  dVar4 = (double)(fVar5 + fVar2);
  if (n < 2) {
    zt_log_lprintf((zt_log_ty *)0x0,zt_log_info,"%s took: %4.2fs user %4.2fs system %4.2fs total",
                   dVar1,dVar3,dVar4,name);
    return;
  }
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_info,
                 "%d calls of %s took: %4.2fs user %4.2fs system %4.2fs total",dVar1,dVar3,dVar4,
                 (ulong)(uint)n);
  return;
}

Assistant:

void
zt_time_result_to_elapsed(struct time_result *result, float *usr, float *sys, float *total)
{
    zt_assert(result);
    zt_assert(usr);
    zt_assert(sys);
    zt_assert(total);

    *usr = (float) (result->usr_time.tv_sec + result->usr_time.tv_usec / 1000000.0);
    *sys = (float) (result->sys_time.tv_sec + result->sys_time.tv_usec / 1000000.0);
    *total = *usr + *sys;
}